

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O0

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,bool hmm)

{
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> tmp;
  bool in_stack_0000018f;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_00000190;
  string *in_stack_00000198;
  QuerySegment *in_stack_000001a0;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_ffffffffffffffc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_ffffffffffffffd0;
  
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::vector
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x16a593);
  Cut(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018f);
  GetStringsFromWords(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Cut(const string& sentence, vector<string>& words, bool hmm) const {
    vector<Word> tmp;
    Cut(sentence, tmp, hmm);
    GetStringsFromWords(tmp, words);
  }